

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O0

string * StrFormatInternalBug_abi_cxx11_(string_view msg,string_view file,int line,string_view func)

{
  long lVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  string *in_RDI;
  char *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  char (*in_stack_00000160) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000168;
  char (*in_stack_00000170) [42];
  char *this;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  string *args_2;
  undefined4 in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = in_RDI;
  FormatFullVersion_abi_cxx11_();
  this = "Bitcoin Core";
  tinyformat::
  format<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
            (in_R8,in_RCX,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_R9D,in_stack_ffffffffffffffb0),(int *)args_2,in_stack_ffffffffffffffa0,
             in_stack_00000160,in_stack_00000168,in_stack_00000170);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string StrFormatInternalBug(std::string_view msg, std::string_view file, int line, std::string_view func)
{
    return strprintf("Internal bug detected: %s\n%s:%d (%s)\n"
                     "%s %s\n"
                     "Please report this issue here: %s\n",
                     msg, file, line, func, PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
}